

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O2

int __thiscall DetectorSS::PointQuery(DetectorSS *this,uint32_t key)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  int i;
  long lVar4;
  uint32_t key_local;
  uint32_t hashval [4];
  uint32_t hkey [3];
  
  hashval[0] = 0;
  hashval[1] = 0;
  hashval[2] = 0;
  hashval[3] = 0;
  key_local = key;
  hkey[0] = key;
  hkey[1] = key;
  hkey[2] = key;
  MurmurHash3_x64_128(hkey,0xc,(uint32_t)*(this->ss_).hash,hashval);
  iVar1 = 0;
  for (lVar4 = 0; lVar4 < (this->ss_).tdepth; lVar4 = lVar4 + 1) {
    iVar2 = (int)((long)(this->ss_).width * (ulong)hashval[lVar4] >> 0x20);
    if (lVar4 == 0) {
      iVar1 = Estimate(this,iVar2,*(this->ss_).counts);
    }
    iVar2 = Estimate(this,iVar2,(this->ss_).counts[lVar4]);
    if (iVar2 <= iVar1) {
      iVar1 = iVar2;
    }
  }
  for (lVar4 = 4; lVar4 < (this->ss_).depth; lVar4 = lVar4 + 1) {
    uVar3 = MurmurHash64A(&key_local,(this->ss_).lgn / 8,(this->ss_).hash[lVar4]);
    iVar2 = Estimate(this,(int)((long)(this->ss_).width * (uVar3 & 0xffffffff) >> 0x20),
                     (this->ss_).counts[lVar4]);
    if (iVar2 <= iVar1) {
      iVar1 = iVar2;
    }
  }
  return iVar1;
}

Assistant:

int DetectorSS::PointQuery(uint32_t key) {
	uint32_t hkey[3] = { key, key, key };
	uint32_t hashval[4] = { 0 };
	MurmurHash3_x64_128((unsigned char*)hkey, 12, ss_.hash[0], (unsigned char*)hashval);
	int ret = 0;
	int degree = 0;
	for (int i = 0; i < ss_.tdepth; i++) {
		unsigned bucket = (uint32_t)hashval[i] * (unsigned long)ss_.width >> 32;
		if (i == 0) {
			ret = Estimate(bucket, ss_.counts[i]);
		}
		degree = Estimate(bucket, ss_.counts[i]);
		ret = ret > degree ? degree : ret;
	}
	for (int i = 4; i < ss_.depth; i++) {
		unsigned bucket = MurmurHash64A((unsigned char*)(&key), ss_.lgn / 8, ss_.hash[i]);
		bucket = (bucket * (unsigned long)ss_.width) >> 32;
		degree = Estimate(bucket, ss_.counts[i]);
		ret = ret > degree ? degree : ret;
	}
	return ret;
}